

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O2

bool __thiscall
re2::RE2::Match(RE2 *this,StringPiece *text,size_t startpos,size_t endpos,Anchor re_anchor,
               StringPiece *submatch,int nsubmatch)

{
  byte *pbVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Anchor AVar5;
  ostream *poVar6;
  Prog *pPVar7;
  StringPiece *pSVar8;
  long lVar9;
  Anchor anchor;
  byte *pbVar10;
  ulong uVar11;
  byte bVar12;
  unsigned_short *puVar13;
  byte *__s1;
  ulong uVar14;
  MatchKind kind;
  Anchor AVar15;
  ulong uVar16;
  byte bVar17;
  byte *__s2;
  bool dfa_failed;
  Anchor local_21c;
  Prog *local_218;
  unsigned_short *local_210;
  ulong local_208;
  StringPiece *local_200;
  StringPiece local_1f8;
  ulong local_1e8;
  StringPiece *local_1e0;
  StringPiece local_1d8;
  StringPiece match;
  LogMessage local_1b0;
  
  if (this->error_code_ != NoError) {
    if ((this->options_).log_errors_ != true) {
      return false;
    }
    LogMessage::LogMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/re2.cc"
               ,0x244);
    poVar6 = std::operator<<((ostream *)&local_1b0.str_,"Invalid RE2: ");
    std::operator<<(poVar6,(string *)this->error_);
    goto LAB_00198eab;
  }
  if (startpos <= endpos) {
    uVar14 = text->size_;
    if (endpos < uVar14 || endpos - uVar14 == 0) {
      __s2 = (byte *)(text->data_ + startpos);
      local_1f8.data_ = (const_pointer)__s2;
      uVar11 = (text->size_ - startpos) + (endpos - uVar14);
      local_1f8.size_ = uVar11;
      match.data_ = (const_pointer)0x0;
      match.size_ = 0;
      local_1e0 = (StringPiece *)0x0;
      if (nsubmatch != 0) {
        local_1e0 = &match;
      }
      AVar15 = this->num_captures_ + ANCHOR_START;
      if (nsubmatch <= this->num_captures_) {
        AVar15 = nsubmatch;
      }
      local_218 = this->prog_;
      bVar2 = local_218->anchor_start_;
      if ((startpos != 0 & bVar2) != 0) {
        return false;
      }
      if ((bVar2 == false) || (local_218->anchor_end_ == false)) {
        AVar5 = re_anchor;
        if (bVar2 != false) {
          AVar5 = ANCHOR_START;
        }
        if (re_anchor == ANCHOR_BOTH) {
          AVar5 = re_anchor;
        }
      }
      else {
        AVar5 = ANCHOR_BOTH;
      }
      uVar16 = (this->prefix_)._M_string_length;
      local_200 = text;
      if (uVar16 == 0) {
      }
      else {
        if (startpos != 0) {
          return false;
        }
        if (uVar11 < uVar16) {
          return false;
        }
        __s1 = (byte *)(this->prefix_)._M_dataplus._M_p;
        local_21c = AVar5;
        local_1e8 = uVar14;
        if (this->prefix_foldcase_ == true) {
          pbVar1 = __s1 + uVar16;
          pbVar10 = __s2;
          for (; __s1 < pbVar1; __s1 = __s1 + 1) {
            bVar17 = *pbVar10;
            bVar12 = bVar17 | 0x20;
            if (0x19 < (byte)(bVar17 + 0xbf)) {
              bVar12 = bVar17;
            }
            if (*__s1 != bVar12) {
              return false;
            }
            pbVar10 = pbVar10 + 1;
          }
        }
        else {
          iVar4 = bcmp(__s1,__s2,uVar16);
          if (iVar4 != 0) {
            return false;
          }
        }
        local_1f8.data_ = (const_pointer)(__s2 + uVar16);
        local_1f8.size_ = uVar11 - uVar16;
        AVar5 = (local_21c == ANCHOR_BOTH) + ANCHOR_START;
        uVar14 = local_1e8;
      }
      pPVar7 = local_218;
      anchor = kAnchored;
      bVar2 = (this->options_).longest_match_;
      kind = (MatchKind)bVar2;
      bVar17 = (int)AVar15 < 6 & this->is_one_pass_;
      puVar13 = (local_218->list_heads_).ptr_._M_t.
                super___uniq_ptr_impl<unsigned_short,_re2::PODArray<unsigned_short>::Deleter>._M_t.
                super__Tuple_impl<0UL,_unsigned_short_*,_re2::PODArray<unsigned_short>::Deleter>.
                super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl;
      local_1e8 = (ulong)(int)(0x40000 / (long)local_218->list_count_);
      dfa_failed = false;
      if (AVar5 == ANCHOR_START) {
LAB_0019907b:
        if (((bVar17 == 1 && uVar14 < 0x1001) && (uVar14 < 9 || 1 < (int)AVar15)) ||
           ((puVar13 != (unsigned_short *)0x0 && (uVar14 <= local_1e8 && 1 < (int)AVar15)))) {
          anchor = kAnchored;
        }
        else {
          local_21c = AVar15;
          local_210 = puVar13;
          local_208 = uVar16;
          bVar2 = Prog::SearchDFA(local_218,&local_1f8,local_200,kAnchored,kind,&match,&dfa_failed,
                                  (SparseSet *)0x0);
          if (bVar2) {
LAB_00199104:
            uVar16 = local_208;
            AVar15 = local_21c;
            if ((int)local_21c < 2) {
              if (local_21c == ANCHOR_START) {
                submatch->data_ = match.data_;
                submatch->size_ = match.size_;
              }
              goto LAB_00199599;
            }
            bVar2 = false;
            pSVar8 = &match;
            puVar13 = local_210;
            kind = kFullMatch;
            goto LAB_00199473;
          }
          if (dfa_failed != true) {
            return false;
          }
          puVar13 = local_210;
          uVar16 = local_208;
          AVar15 = local_21c;
          anchor = kAnchored;
          if ((this->options_).log_errors_ == true) {
            LogMessage::LogMessage
                      (&local_1b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/re2.cc"
                       ,0x2d7);
            poVar6 = std::operator<<((ostream *)&local_1b0.str_,"DFA out of memory: size ");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->prog_->size_);
            poVar6 = std::operator<<(poVar6,", ");
            poVar6 = std::operator<<(poVar6,"bytemap range ");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->prog_->bytemap_range_);
            poVar6 = std::operator<<(poVar6,", ");
            poVar6 = std::operator<<(poVar6,"list count ");
            std::ostream::operator<<(poVar6,this->prog_->list_count_);
            LogMessage::~LogMessage(&local_1b0);
            puVar13 = local_210;
            uVar16 = local_208;
            AVar15 = local_21c;
          }
        }
LAB_00199469:
        bVar2 = true;
        pSVar8 = &local_1f8;
      }
      else {
        if (AVar5 == ANCHOR_BOTH) {
          kind = kFullMatch;
          goto LAB_0019907b;
        }
        local_218 = (Prog *)CONCAT44(local_218._4_4_,(uint)bVar2);
        local_21c = AVar15;
        local_210 = puVar13;
        local_208 = uVar16;
        bVar2 = Prog::SearchDFA(pPVar7,&local_1f8,local_200,kUnanchored,(uint)bVar2,local_1e0,
                                &dfa_failed,(SparseSet *)0x0);
        if (!bVar2) {
          if (dfa_failed != true) {
            return false;
          }
          if ((this->options_).log_errors_ == true) {
            LogMessage::LogMessage
                      (&local_1b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/re2.cc"
                       ,0x29a);
            poVar6 = std::operator<<((ostream *)&local_1b0.str_,"DFA out of memory: size ");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->prog_->size_);
            poVar6 = std::operator<<(poVar6,", ");
            poVar6 = std::operator<<(poVar6,"bytemap range ");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->prog_->bytemap_range_);
            poVar6 = std::operator<<(poVar6,", ");
            poVar6 = std::operator<<(poVar6,"list count ");
            std::ostream::operator<<(poVar6,this->prog_->list_count_);
            LogMessage::~LogMessage(&local_1b0);
          }
          puVar13 = local_210;
          uVar16 = local_208;
          AVar15 = local_21c;
          kind = (MatchKind)local_218;
          anchor = kUnanchored;
          goto LAB_00199469;
        }
        if (nsubmatch == 0) {
          return true;
        }
        pPVar7 = ReverseProg(this);
        if (pPVar7 == (Prog *)0x0) {
          return false;
        }
        bVar2 = Prog::SearchDFA(pPVar7,&match,local_200,kAnchored,kLongestMatch,&match,&dfa_failed,
                                (SparseSet *)0x0);
        if (bVar2) goto LAB_00199104;
        bVar2 = (this->options_).log_errors_;
        if (dfa_failed != true) {
          if (bVar2 == false) {
            return false;
          }
          LogMessage::LogMessage
                    (&local_1b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/re2.cc"
                     ,0x2b7);
          std::operator<<((ostream *)&local_1b0.str_,"SearchDFA inconsistency");
          goto LAB_00198eab;
        }
        if (bVar2 != false) {
          LogMessage::LogMessage
                    (&local_1b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/re2.cc"
                     ,0x2af);
          poVar6 = std::operator<<((ostream *)&local_1b0.str_,"DFA out of memory: size ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,pPVar7->size_);
          poVar6 = std::operator<<(poVar6,", ");
          poVar6 = std::operator<<(poVar6,"bytemap range ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,pPVar7->bytemap_range_);
          poVar6 = std::operator<<(poVar6,", ");
          poVar6 = std::operator<<(poVar6,"list count ");
          std::ostream::operator<<(poVar6,pPVar7->list_count_);
          LogMessage::~LogMessage(&local_1b0);
        }
        anchor = kUnanchored;
        bVar2 = true;
        pSVar8 = &local_1f8;
        puVar13 = local_210;
        uVar16 = local_208;
        AVar15 = local_21c;
        kind = (MatchKind)local_218;
      }
LAB_00199473:
      local_1d8.data_ = pSVar8->data_;
      local_1d8.size_ = pSVar8->size_;
      if (bVar17 == 1 && anchor != kUnanchored) {
        bVar3 = Prog::SearchOnePass(this->prog_,&local_1d8,local_200,kAnchored,kind,submatch,AVar15)
        ;
        if (bVar3) goto LAB_00199599;
        if (bVar2) {
          return false;
        }
        if ((this->options_).log_errors_ != true) {
          return false;
        }
        LogMessage::LogMessage
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/re2.cc"
                   ,0x2f9);
        std::operator<<((ostream *)&local_1b0.str_,"SearchOnePass inconsistency");
      }
      else if ((puVar13 == (unsigned_short *)0x0) || (local_1e8 < local_1d8.size_)) {
        bVar3 = Prog::SearchNFA(this->prog_,&local_1d8,local_200,anchor,kind,submatch,AVar15);
        if (bVar3) goto LAB_00199599;
        if (bVar2) {
          return false;
        }
        if ((this->options_).log_errors_ != true) {
          return false;
        }
        LogMessage::LogMessage
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/re2.cc"
                   ,0x306);
        std::operator<<((ostream *)&local_1b0.str_,"SearchNFA inconsistency");
      }
      else {
        bVar3 = Prog::SearchBitState(this->prog_,&local_1d8,local_200,anchor,kind,submatch,AVar15);
        if (bVar3) {
LAB_00199599:
          if (0 < nsubmatch && uVar16 != 0) {
            submatch->data_ = submatch->data_ + -uVar16;
            submatch->size_ = submatch->size_ + uVar16;
          }
          lVar9 = (long)(int)AVar15;
          pSVar8 = submatch + lVar9;
          for (; lVar9 < nsubmatch; lVar9 = lVar9 + 1) {
            pSVar8->data_ = (const_pointer)0x0;
            pSVar8->size_ = 0;
            pSVar8 = pSVar8 + 1;
          }
          return true;
        }
        if (bVar2) {
          return false;
        }
        if ((this->options_).log_errors_ != true) {
          return false;
        }
        LogMessage::LogMessage
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/re2.cc"
                   ,0x300);
        std::operator<<((ostream *)&local_1b0.str_,"SearchBitState inconsistency");
      }
      goto LAB_00198eab;
    }
  }
  if ((this->options_).log_errors_ != true) {
    return false;
  }
  LogMessage::LogMessage
            (&local_1b0,
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/re2.cc"
             ,0x24a);
  poVar6 = std::operator<<((ostream *)&local_1b0.str_,"RE2: invalid startpos, endpos pair. [");
  poVar6 = std::operator<<(poVar6,"startpos: ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6,", ");
  poVar6 = std::operator<<(poVar6,"endpos: ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6,", ");
  poVar6 = std::operator<<(poVar6,"text size: ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::operator<<(poVar6,"]");
LAB_00198eab:
  LogMessage::~LogMessage(&local_1b0);
  return false;
}

Assistant:

bool RE2::Match(const StringPiece& text,
                size_t startpos,
                size_t endpos,
                Anchor re_anchor,
                StringPiece* submatch,
                int nsubmatch) const {
  if (!ok()) {
    if (options_.log_errors())
      LOG(ERROR) << "Invalid RE2: " << *error_;
    return false;
  }

  if (startpos > endpos || endpos > text.size()) {
    if (options_.log_errors())
      LOG(ERROR) << "RE2: invalid startpos, endpos pair. ["
                 << "startpos: " << startpos << ", "
                 << "endpos: " << endpos << ", "
                 << "text size: " << text.size() << "]";
    return false;
  }

  StringPiece subtext = text;
  subtext.remove_prefix(startpos);
  subtext.remove_suffix(text.size() - endpos);

  // Use DFAs to find exact location of match, filter out non-matches.

  // Don't ask for the location if we won't use it.
  // SearchDFA can do extra optimizations in that case.
  StringPiece match;
  StringPiece* matchp = &match;
  if (nsubmatch == 0)
    matchp = NULL;

  int ncap = 1 + NumberOfCapturingGroups();
  if (ncap > nsubmatch)
    ncap = nsubmatch;

  // If the regexp is anchored explicitly, must not be in middle of text.
  if (prog_->anchor_start() && startpos != 0)
    return false;

  // If the regexp is anchored explicitly, update re_anchor
  // so that we can potentially fall into a faster case below.
  if (prog_->anchor_start() && prog_->anchor_end())
    re_anchor = ANCHOR_BOTH;
  else if (prog_->anchor_start() && re_anchor != ANCHOR_BOTH)
    re_anchor = ANCHOR_START;

  // Check for the required prefix, if any.
  size_t prefixlen = 0;
  if (!prefix_.empty()) {
    if (startpos != 0)
      return false;
    prefixlen = prefix_.size();
    if (prefixlen > subtext.size())
      return false;
    if (prefix_foldcase_) {
      if (ascii_strcasecmp(&prefix_[0], subtext.data(), prefixlen) != 0)
        return false;
    } else {
      if (memcmp(&prefix_[0], subtext.data(), prefixlen) != 0)
        return false;
    }
    subtext.remove_prefix(prefixlen);
    // If there is a required prefix, the anchor must be at least ANCHOR_START.
    if (re_anchor != ANCHOR_BOTH)
      re_anchor = ANCHOR_START;
  }

  Prog::Anchor anchor = Prog::kUnanchored;
  Prog::MatchKind kind = Prog::kFirstMatch;
  if (options_.longest_match())
    kind = Prog::kLongestMatch;
  bool skipped_test = false;

  bool can_one_pass = (is_one_pass_ && ncap <= Prog::kMaxOnePassCapture);

  // BitState allocates a bitmap of size prog_->list_count() * text.size().
  // It also allocates a stack of 3-word structures which could potentially
  // grow as large as prog_->list_count() * text.size(), but in practice is
  // much smaller.
  const int kMaxBitStateBitmapSize = 256*1024;  // bitmap size <= max (bits)
  bool can_bit_state = prog_->CanBitState();
  size_t bit_state_text_max = kMaxBitStateBitmapSize / prog_->list_count();

  bool dfa_failed = false;
  switch (re_anchor) {
    default:
    case UNANCHORED: {
      if (!prog_->SearchDFA(subtext, text, anchor, kind,
                            matchp, &dfa_failed, NULL)) {
        if (dfa_failed) {
          if (options_.log_errors())
            LOG(ERROR) << "DFA out of memory: size " << prog_->size() << ", "
                       << "bytemap range " << prog_->bytemap_range() << ", "
                       << "list count " << prog_->list_count();
          // Fall back to NFA below.
          skipped_test = true;
          break;
        }
        return false;
      }
      if (matchp == NULL)  // Matched.  Don't care where
        return true;
      // SearchDFA set match[0].end() but didn't know where the
      // match started.  Run the regexp backward from match[0].end()
      // to find the longest possible match -- that's where it started.
      Prog* prog = ReverseProg();
      if (prog == NULL)
        return false;
      if (!prog->SearchDFA(match, text, Prog::kAnchored,
                           Prog::kLongestMatch, &match, &dfa_failed, NULL)) {
        if (dfa_failed) {
          if (options_.log_errors())
            LOG(ERROR) << "DFA out of memory: size " << prog->size() << ", "
                       << "bytemap range " << prog->bytemap_range() << ", "
                       << "list count " << prog->list_count();
          // Fall back to NFA below.
          skipped_test = true;
          break;
        }
        if (options_.log_errors())
          LOG(ERROR) << "SearchDFA inconsistency";
        return false;
      }
      break;
    }

    case ANCHOR_BOTH:
    case ANCHOR_START:
      if (re_anchor == ANCHOR_BOTH)
        kind = Prog::kFullMatch;
      anchor = Prog::kAnchored;

      // If only a small amount of text and need submatch
      // information anyway and we're going to use OnePass or BitState
      // to get it, we might as well not even bother with the DFA:
      // OnePass or BitState will be fast enough.
      // On tiny texts, OnePass outruns even the DFA, and
      // it doesn't have the shared state and occasional mutex that
      // the DFA does.
      if (can_one_pass && text.size() <= 4096 &&
          (ncap > 1 || text.size() <= 8)) {
        skipped_test = true;
        break;
      }
      if (can_bit_state && text.size() <= bit_state_text_max && ncap > 1) {
        skipped_test = true;
        break;
      }
      if (!prog_->SearchDFA(subtext, text, anchor, kind,
                            &match, &dfa_failed, NULL)) {
        if (dfa_failed) {
          if (options_.log_errors())
            LOG(ERROR) << "DFA out of memory: size " << prog_->size() << ", "
                       << "bytemap range " << prog_->bytemap_range() << ", "
                       << "list count " << prog_->list_count();
          // Fall back to NFA below.
          skipped_test = true;
          break;
        }
        return false;
      }
      break;
  }

  if (!skipped_test && ncap <= 1) {
    // We know exactly where it matches.  That's enough.
    if (ncap == 1)
      submatch[0] = match;
  } else {
    StringPiece subtext1;
    if (skipped_test) {
      // DFA ran out of memory or was skipped:
      // need to search in entire original text.
      subtext1 = subtext;
    } else {
      // DFA found the exact match location:
      // let NFA run an anchored, full match search
      // to find submatch locations.
      subtext1 = match;
      anchor = Prog::kAnchored;
      kind = Prog::kFullMatch;
    }

    if (can_one_pass && anchor != Prog::kUnanchored) {
      if (!prog_->SearchOnePass(subtext1, text, anchor, kind, submatch, ncap)) {
        if (!skipped_test && options_.log_errors())
          LOG(ERROR) << "SearchOnePass inconsistency";
        return false;
      }
    } else if (can_bit_state && subtext1.size() <= bit_state_text_max) {
      if (!prog_->SearchBitState(subtext1, text, anchor,
                                 kind, submatch, ncap)) {
        if (!skipped_test && options_.log_errors())
          LOG(ERROR) << "SearchBitState inconsistency";
        return false;
      }
    } else {
      if (!prog_->SearchNFA(subtext1, text, anchor, kind, submatch, ncap)) {
        if (!skipped_test && options_.log_errors())
          LOG(ERROR) << "SearchNFA inconsistency";
        return false;
      }
    }
  }

  // Adjust overall match for required prefix that we stripped off.
  if (prefixlen > 0 && nsubmatch > 0)
    submatch[0] = StringPiece(submatch[0].data() - prefixlen,
                              submatch[0].size() + prefixlen);

  // Zero submatches that don't exist in the regexp.
  for (int i = ncap; i < nsubmatch; i++)
    submatch[i] = StringPiece();
  return true;
}